

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdMicroAllocator.cpp
# Opt level: O1

void __thiscall
HACD::MyMicroAllocator::addMicroChunk
          (MyMicroAllocator *this,NxU8 *memStart,NxU8 *memEnd,MemoryChunk *chunk)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  MicroChunk *pMVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  
  if (this->mMaxMicroChunks <= this->mMicroChunkCount) {
    allocateMicroChunks(this);
  }
  uVar7 = this->mMicroChunkCount;
  uVar8 = (ulong)uVar7;
  if (uVar8 != 0) {
    lVar9 = 0;
    uVar10 = 0;
    do {
      if (memEnd < *(NxU8 **)((long)&this->mMicroChunks->mMemStart + lVar9)) {
        if ((uint)uVar10 < uVar7) {
          lVar11 = uVar8 << 5;
          do {
            uVar8 = uVar8 - 1;
            puVar2 = (undefined8 *)((long)&this->mMicroChunks[-1].mMemStart + lVar11);
            uVar4 = puVar2[1];
            uVar5 = puVar2[2];
            uVar6 = puVar2[3];
            puVar1 = (undefined8 *)((long)&this->mMicroChunks->mMemStart + lVar11);
            *puVar1 = *puVar2;
            puVar1[1] = uVar4;
            puVar1[2] = uVar5;
            puVar1[3] = uVar6;
            lVar11 = lVar11 + -0x20;
          } while (uVar10 < uVar8);
        }
        pMVar3 = this->mMicroChunks;
        *(NxU8 **)((long)&pMVar3->mMemStart + lVar9) = memStart;
        *(NxU8 **)((long)&pMVar3->mMemEnd + lVar9) = memEnd;
        *(MemoryChunk **)((long)&pMVar3->mChunk + lVar9) = chunk;
        *(undefined8 *)((long)&pMVar3->mPad + lVar9) = 0;
        this->mLastMicroChunk = (MicroChunk *)((long)&pMVar3->mMemStart + lVar9);
        uVar7 = this->mMicroChunkCount;
        goto LAB_0085bc17;
      }
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x20;
    } while (uVar7 != (uint)uVar10);
  }
  pMVar3 = this->mMicroChunks;
  uVar7 = this->mMicroChunkCount;
  pMVar3[uVar7].mMemStart = memStart;
  pMVar3[uVar7].mMemEnd = memEnd;
  pMVar3[uVar7].mChunk = chunk;
  pMVar3[uVar7].mPad = (NxU8 *)0x0;
  this->mLastMicroChunk = pMVar3 + uVar7;
LAB_0085bc17:
  this->mMicroChunkCount = uVar7 + 1;
  return;
}

Assistant:

virtual void addMicroChunk(NxU8 *memStart,NxU8 *memEnd,MemoryChunk *chunk)
  {
    if ( mMicroChunkCount >= mMaxMicroChunks )
    {
        allocateMicroChunks();
    }

    bool inserted = false;
    for (NxU32 i=0; i<mMicroChunkCount; i++)
    {
        if ( memEnd < mMicroChunks[i].mMemStart )
        {
            for (NxU32 j=mMicroChunkCount; j>i; j--)
            {
                mMicroChunks[j] = mMicroChunks[j-1];
            }
            mMicroChunks[i].set( memStart, memEnd, chunk );
			mLastMicroChunk = &mMicroChunks[i];
            mMicroChunkCount++;
            inserted = true;
            break;
        }
    }
    if ( !inserted )
    {
        mMicroChunks[mMicroChunkCount].set(memStart,memEnd,chunk);
		mLastMicroChunk = &mMicroChunks[mMicroChunkCount];
        mMicroChunkCount++;
    }
  }